

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cpp
# Opt level: O0

int __thiscall ncnn::ReLU::forward_inplace(ReLU *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  long lVar2;
  int iVar3;
  long *in_RSI;
  long lVar4;
  long in_RDI;
  int i_1;
  float *ptr_1;
  int q_1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  int local_27c;
  int local_224;
  int local_220;
  int local_1c0;
  
  lVar2 = in_RSI[7];
  iVar3 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34);
  if ((*(float *)(in_RDI + 0xd0) != 0.0) || (NAN(*(float *)(in_RDI + 0xd0)))) {
    for (local_224 = 0; local_224 < (int)lVar2; local_224 = local_224 + 1) {
      lVar4 = *in_RSI + in_RSI[8] * (long)local_224 * in_RSI[2];
      for (local_27c = 0; local_27c < iVar3; local_27c = local_27c + 1) {
        pfVar1 = (float *)(lVar4 + (long)local_27c * 4);
        if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
          *(float *)(lVar4 + (long)local_27c * 4) =
               *(float *)(in_RDI + 0xd0) * *(float *)(lVar4 + (long)local_27c * 4);
        }
      }
    }
  }
  else {
    for (local_1c0 = 0; local_1c0 < (int)lVar2; local_1c0 = local_1c0 + 1) {
      lVar4 = *in_RSI + in_RSI[8] * (long)local_1c0 * in_RSI[2];
      for (local_220 = 0; local_220 < iVar3; local_220 = local_220 + 1) {
        pfVar1 = (float *)(lVar4 + (long)local_220 * 4);
        if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
          *(undefined4 *)(lVar4 + (long)local_220 * 4) = 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

int ReLU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}